

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

xmlChar * xmlTextWriterVSprintf(char *format,__va_list_tag *argptr)

{
  bool bVar1;
  int iVar2;
  undefined8 uStack_48;
  va_list locarg;
  xmlChar *buf;
  int count;
  int size;
  __va_list_tag *argptr_local;
  char *format_local;
  
  buf._4_4_ = 0x2000;
  locarg[0].reg_save_area = (*xmlMalloc)(0x2000);
  if (locarg[0].reg_save_area == (void *)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_NO_MEMORY,
                    "xmlTextWriterVSprintf : out of memory!\n");
  }
  else {
    locarg[0].overflow_arg_area = argptr->reg_save_area;
    uStack_48._0_4_ = argptr->gp_offset;
    uStack_48._4_4_ = argptr->fp_offset;
    locarg[0]._0_8_ = argptr->overflow_arg_area;
    while( true ) {
      iVar2 = vsnprintf((char *)locarg[0].reg_save_area,(long)buf._4_4_,format,&uStack_48);
      bVar1 = true;
      if (((-1 < iVar2) && (bVar1 = true, iVar2 != buf._4_4_ + -1)) &&
         (bVar1 = true, iVar2 != buf._4_4_)) {
        bVar1 = buf._4_4_ < iVar2;
      }
      if (!bVar1) {
        return (xmlChar *)locarg[0].reg_save_area;
      }
      (*xmlFree)(locarg[0].reg_save_area);
      buf._4_4_ = buf._4_4_ + 0x2000;
      locarg[0].reg_save_area = (*xmlMalloc)((long)buf._4_4_);
      if (locarg[0].reg_save_area == (void *)0x0) break;
      locarg[0].overflow_arg_area = argptr->reg_save_area;
      uStack_48._0_4_ = argptr->gp_offset;
      uStack_48._4_4_ = argptr->fp_offset;
      locarg[0]._0_8_ = argptr->overflow_arg_area;
    }
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_NO_MEMORY,
                    "xmlTextWriterVSprintf : out of memory!\n");
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlTextWriterVSprintf(const char *format, va_list argptr)
{
    int size;
    int count;
    xmlChar *buf;
    va_list locarg;

    size = BUFSIZ;
    buf = (xmlChar *) xmlMalloc(size);
    if (buf == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlTextWriterVSprintf : out of memory!\n");
        return NULL;
    }

    va_copy(locarg, argptr);
    while (((count = vsnprintf((char *) buf, size, format, locarg)) < 0)
           || (count == size - 1) || (count == size) || (count > size)) {
	va_end(locarg);
        xmlFree(buf);
        size += BUFSIZ;
        buf = (xmlChar *) xmlMalloc(size);
        if (buf == NULL) {
            xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                            "xmlTextWriterVSprintf : out of memory!\n");
            return NULL;
        }
	va_copy(locarg, argptr);
    }
    va_end(locarg);

    return buf;
}